

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  if (this->has_permanent_fd_ == true) {
    close(this->fd_);
    LOCK();
    (this->fd_limiter_->acquires_allowed_).super___atomic_base<int>._M_i =
         (this->fd_limiter_->acquires_allowed_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::__cxx11::string::_M_dispose();
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

~PosixRandomAccessFile() override {
    if (has_permanent_fd_) {
      assert(fd_ != -1);
      ::close(fd_);
      fd_limiter_->Release();
    }
  }